

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O1

Aig_Man_t * Aig_ManDupArray(Vec_Ptr_t *vArray)

{
  uint uVar1;
  void *pvVar2;
  char *__s;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Aig_Obj_t *p1;
  int iVar8;
  Aig_Obj_t *pAVar9;
  undefined8 *puVar10;
  long lVar11;
  
  uVar1 = vArray->nSize;
  if ((ulong)uVar1 == 0) {
    p = (Aig_Man_t *)0x0;
  }
  else {
    if ((int)uVar1 < 1) {
LAB_005fbec3:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    puVar10 = (undefined8 *)*vArray->pArray;
    uVar7 = 0;
    do {
      pvVar2 = vArray->pArray[uVar7];
      if (*(int *)((long)pvVar2 + 0x68) != 0) {
        __assert_fail("Aig_ManRegNum(pNew) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                      ,0x4f1,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
      if (*(int *)((long)pvVar2 + 0x88) != *(int *)(puVar10 + 0x11)) {
        __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigDup.c"
                      ,0x4f2,"Aig_Man_t *Aig_ManDupArray(Vec_Ptr_t *)");
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    p = Aig_ManStart(10000);
    __s = (char *)*puVar10;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(__s);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,__s);
    }
    p->pName = __dest;
    if (0 < *(int *)(puVar10[2] + 4)) {
      iVar8 = 0;
      do {
        Aig_ObjCreateCi(p);
        iVar8 = iVar8 + 1;
      } while (iVar8 < *(int *)(puVar10[2] + 4));
    }
    if (0 < vArray->nSize) {
      lVar11 = 0;
      do {
        puVar10 = (undefined8 *)vArray->pArray[lVar11];
        *(Aig_Obj_t **)(puVar10[6] + 0x28) = p->pConst1;
        lVar6 = puVar10[2];
        if (0 < *(int *)(lVar6 + 4)) {
          lVar4 = 0;
          do {
            if (p->vCis->nSize <= lVar4) goto LAB_005fbec3;
            *(void **)(*(long *)(*(long *)(lVar6 + 8) + lVar4 * 8) + 0x28) = p->vCis->pArray[lVar4];
            lVar4 = lVar4 + 1;
            lVar6 = puVar10[2];
          } while (lVar4 < *(int *)(lVar6 + 4));
        }
        lVar6 = puVar10[4];
        if (0 < *(int *)(lVar6 + 4)) {
          lVar4 = 0;
          do {
            uVar7 = *(ulong *)(*(long *)(lVar6 + 8) + lVar4 * 8);
            if ((uVar7 != 0) && (0xfffffffd < (*(uint *)(uVar7 + 0x18) & 7) - 7)) {
              if ((uVar7 & 1) != 0) goto LAB_005fbea4;
              uVar5 = *(ulong *)(uVar7 + 8) & 0xfffffffffffffffe;
              if (uVar5 == 0) {
                pAVar9 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar9 = (Aig_Obj_t *)
                         ((ulong)((uint)*(ulong *)(uVar7 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
              }
              uVar5 = *(ulong *)(uVar7 + 0x10) & 0xfffffffffffffffe;
              if (uVar5 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              else {
                p1 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(uVar7 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
              }
              pAVar9 = Aig_And(p,pAVar9,p1);
              *(Aig_Obj_t **)(uVar7 + 0x28) = pAVar9;
            }
            lVar4 = lVar4 + 1;
            lVar6 = puVar10[4];
          } while (lVar4 < *(int *)(lVar6 + 4));
        }
        lVar6 = puVar10[3];
        if (0 < *(int *)(lVar6 + 4)) {
          lVar4 = 0;
          do {
            uVar7 = *(ulong *)(*(long *)(lVar6 + 8) + lVar4 * 8);
            if ((uVar7 & 1) != 0) {
LAB_005fbea4:
              __assert_fail("!Aig_IsComplement(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                            ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
            }
            uVar7 = *(ulong *)(uVar7 + 8);
            uVar5 = uVar7 & 0xfffffffffffffffe;
            if (uVar5 == 0) {
              pAVar9 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar9 = (Aig_Obj_t *)((ulong)((uint)uVar7 & 1) ^ *(ulong *)(uVar5 + 0x28));
            }
            Aig_ObjCreateCo(p,pAVar9);
            lVar4 = lVar4 + 1;
            lVar6 = puVar10[3];
          } while (lVar4 < *(int *)(lVar6 + 4));
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < vArray->nSize);
    }
    Aig_ManSetRegNum(p,*(int *)(puVar10 + 0xd));
    iVar8 = Aig_ManCheck(p);
    if (iVar8 == 0) {
      puts("Aig_ManDupSimple(): The check has failed.");
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManDupArray( Vec_Ptr_t * vArray )
{
    Aig_Man_t * p, * pNew;
    Aig_Obj_t * pObj;
    int i, k;
    if ( Vec_PtrSize(vArray) == 0 )
        return NULL;
    p = (Aig_Man_t *)Vec_PtrEntry( vArray, 0 );
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, pNew, k )
    {
        assert( Aig_ManRegNum(pNew) == 0 );
        assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(p) );
    }
    // create the new manager
    pNew = Aig_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjCreateCi(pNew);
    // create the PIs
    Vec_PtrForEachEntry( Aig_Man_t *, vArray, p, k )
    {
        Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
        Aig_ManForEachCi( p, pObj, i )
            pObj->pData = Aig_ManCi( pNew, i );
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        Aig_ManForEachCo( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}